

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward8.c
# Opt level: O3

void frssort1(string *strings,size_t scnt)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  list_conflict plVar4;
  list_conflict __ptr;
  group_conflict g;
  group pgVar5;
  list plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  group pgVar9;
  int pos;
  ulong uVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  undefined8 extraout_RDX_02;
  undefined8 *puVar12;
  list_conflict plVar13;
  uint uVar14;
  character ch;
  uint p;
  bucket_conflict *b;
  long lVar15;
  
  __ptr = (list_conflict)calloc(scnt,0x18);
  if (scnt != 0) {
    uVar10 = 0;
    plVar4 = __ptr;
    do {
      plVar4->str = strings[uVar10];
      plVar13 = (list_conflict)0x0;
      if (uVar10 < scnt - 1) {
        plVar13 = plVar4 + 1;
      }
      plVar4->next = plVar13;
      uVar10 = uVar10 + 1;
      plVar4 = plVar4 + 1;
    } while (scnt != uVar10);
    plVar6 = __ptr;
    if (1 < (int)scnt) {
      initmem(groupmem,0x30,(int)((scnt & 0xffffffff) / 0xf));
      initmem(bucketmem,0x28,(int)((scnt & 0xffffffff) / 5));
      g = (group_conflict)allocmem(groupmem,0x30);
      pgVar5 = (group)allocmem(groupmem,0x30);
      g->nextunf = pgVar5;
      g->next = pgVar5;
      pgVar5->head = __ptr;
      pgVar5->finis = 0;
      pgVar5->next = (group)0x0;
      pgVar5->nextunf = (group)0x0;
      b = (bucket_conflict *)0x0;
      intobuckets(g,(bucket_conflict *)0x0,pos);
      pgVar5 = g->nextunf;
      uVar11 = extraout_RDX;
      while (pgVar5 != (group)0x0) {
        p = (int)b + 1;
        b = (bucket_conflict *)(ulong)p;
        lVar15 = 0;
        do {
          puVar12 = (undefined8 *)(&forward1_b)[lVar15];
          if (puVar12 != (undefined8 *)0x0) {
            do {
              if ((lVar15 == 0) || (0x13 < *(int *)(puVar12 + 2))) {
                plVar6 = (list)*puVar12;
                uVar14 = (uint)(lVar15 == 0);
              }
              else {
                plVar6 = (list)*puVar12;
                uVar14 = 1;
                if (1 < *(int *)(puVar12 + 2)) {
                  plVar6 = ListInsertsort(plVar6,(list_conflict *)(puVar12 + 1),p);
                  *puVar12 = plVar6;
                  uVar11 = extraout_RDX_00;
                }
              }
              lVar1 = puVar12[1];
              plVar2 = (long *)puVar12[3];
              if (*plVar2 == 0) {
                *plVar2 = (long)plVar6;
                plVar2[1] = lVar1;
                *(uint *)(plVar2 + 5) = uVar14;
                plVar2[4] = (long)plVar2;
              }
              else if ((uVar14 == 0) || (lVar3 = plVar2[4], *(int *)(lVar3 + 0x28) == 0)) {
                puVar7 = (undefined8 *)allocmem(groupmem,0x30);
                *puVar7 = plVar6;
                puVar7[1] = lVar1;
                lVar1 = plVar2[4];
                uVar11 = *(undefined8 *)(lVar1 + 0x18);
                puVar7[2] = *(undefined8 *)(lVar1 + 0x10);
                puVar7[3] = uVar11;
                *(uint *)(puVar7 + 5) = uVar14;
                *(undefined8 **)(lVar1 + 0x10) = puVar7;
                *(undefined8 **)(lVar1 + 0x18) = puVar7;
                plVar2[4] = (long)puVar7;
                uVar11 = extraout_RDX_01;
              }
              else {
                *(list *)(*(long *)(lVar3 + 8) + 8) = plVar6;
                *(long *)(lVar3 + 8) = lVar1;
              }
              puVar12 = (undefined8 *)puVar12[4];
            } while (puVar12 != (undefined8 *)0x0);
            (&forward1_b)[lVar15] = 0;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x100);
        intobuckets(g,b,(int)uVar11);
        uVar11 = extraout_RDX_02;
        pgVar5 = g->nextunf;
      }
      pgVar5 = g->next;
      plVar6 = pgVar5->head;
      for (pgVar9 = pgVar5->next; pgVar9 != (group)0x0; pgVar9 = pgVar9->next) {
        pgVar5->tail->next = pgVar9->head;
        pgVar5 = pgVar9;
      }
      freemem(bucketmem);
      freemem(groupmem);
      if (scnt == 0) goto LAB_001dea98;
    }
    sVar8 = 0;
    do {
      strings[sVar8] = plVar6->str;
      sVar8 = sVar8 + 1;
      plVar6 = plVar6->next;
    } while (scnt != sVar8);
  }
LAB_001dea98:
  free(__ptr);
  return;
}

Assistant:

void frssort1(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = forward1(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}